

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O2

Color __thiscall Gradient::evaluate(Gradient *this,float pos)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  pointer pSVar9;
  pointer pSVar10;
  Stop *pSVar11;
  __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
  this_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar12;
  undefined4 uVar13;
  Color CVar14;
  float local_40;
  float local_3c;
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  
  pSVar9 = (this->stops).super__Vector_base<Gradient::Stop,_std::allocator<Gradient::Stop>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar10 = (this->stops).super__Vector_base<Gradient::Stop,_std::allocator<Gradient::Stop>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar9 == pSVar10) {
    fVar3 = 0.0;
    fVar7 = 0.0;
    fVar4 = 0.0;
    fVar8 = 0.0;
  }
  else {
    local_40 = pos;
    this_00 = std::
              __lower_bound<__gnu_cxx::__normal_iterator<Gradient::Stop_const*,std::vector<Gradient::Stop,std::allocator<Gradient::Stop>>>,float,__gnu_cxx::__ops::_Iter_less_val>
                        (pSVar9,pSVar10,&local_40);
    pSVar11 = (this->stops).super__Vector_base<Gradient::Stop,_std::allocator<Gradient::Stop>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (this_00._M_current == pSVar11) {
      uVar1 = (pSVar11->color).r;
      uVar5 = (pSVar11->color).g;
      uVar2 = (pSVar11->color).b;
      uVar6 = (pSVar11->color).a;
      fVar3 = (float)uVar1;
      fVar7 = (float)uVar5;
      fVar4 = (float)uVar2;
      fVar8 = (float)uVar6;
    }
    else {
      pSVar11 = (this->stops).super__Vector_base<Gradient::Stop,_std::allocator<Gradient::Stop>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (this_00._M_current == pSVar11) {
        fVar3 = pSVar11[-1].color.r;
        fVar7 = pSVar11[-1].color.g;
        fVar4 = pSVar11[-1].color.b;
        fVar8 = pSVar11[-1].color.a;
      }
      else {
        uVar12 = 0;
        uVar13 = 0;
        local_3c = (local_40 - this_00._M_current[-1].pos) /
                   ((this_00._M_current)->pos - this_00._M_current[-1].pos);
        CVar14 = Color::operator*(&this_00._M_current[-1].color,1.0 - local_3c);
        local_38._8_4_ = extraout_XMM0_Dc;
        local_38._0_8_ = CVar14._0_8_;
        local_38._12_4_ = extraout_XMM0_Dd;
        local_28._8_4_ = uVar12;
        local_28._0_8_ = CVar14._8_8_;
        local_28._12_4_ = uVar13;
        CVar14 = Color::operator*(&(this_00._M_current)->color,local_3c);
        fVar3 = CVar14.r + (float)local_38._0_4_;
        fVar7 = CVar14.g + (float)local_38._4_4_;
        fVar4 = CVar14.b + (float)local_28._0_4_;
        fVar8 = CVar14.a + (float)local_28._4_4_;
      }
    }
  }
  CVar14.g = fVar7;
  CVar14.r = fVar3;
  CVar14.a = fVar8;
  CVar14.b = fVar4;
  return CVar14;
}

Assistant:

Color evaluate(float pos) const {
		// the stops need to be sorted
		if (stops.empty()) {
			return Color();
		}
		const auto i = std::lower_bound(stops.begin(), stops.end(), pos);
		if (i == stops.begin()) {
			return stops.front().color;
		}
		if (i == stops.end()) {
			return stops.back().color;
		}
		const auto i0 = i - 1;
		const float factor = (pos - i0->pos) / (i->pos - i0->pos);
		return i0->color * (1.f - factor) + i->color * factor;
	}